

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginCustomSection
          (BinaryReaderObjdump *this,Offset size,string_view section_name)

{
  size_type sVar1;
  const_pointer pcVar2;
  Offset size_local;
  BinaryReaderObjdump *this_local;
  string_view section_name_local;
  
  section_name_local.data_ = (char *)section_name.size_;
  this_local = (BinaryReaderObjdump *)section_name.data_;
  sVar1 = string_view::length((string_view *)&this_local);
  pcVar2 = string_view::data((string_view *)&this_local);
  PrintDetails(this," - name: \"%.*s\"\n",sVar1 & 0xffffffff,pcVar2);
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    sVar1 = string_view::length((string_view *)&this_local);
    pcVar2 = string_view::data((string_view *)&this_local);
    printf("\"%.*s\"\n",sVar1 & 0xffffffff,pcVar2);
  }
  Result::Result((Result *)((long)&section_name_local.size_ + 4),Ok);
  return (Result)section_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginCustomSection(Offset size,
                                               string_view section_name) {
  PrintDetails(" - name: \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(section_name));
  if (options_->mode == ObjdumpMode::Headers) {
    printf("\"" PRIstringview "\"\n",
           WABT_PRINTF_STRING_VIEW_ARG(section_name));
  }
  return Result::Ok;
}